

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic_fixed.c
# Opt level: O0

void calc_dim_arithmetic_fixed16
               (rt_variable_t *output,rt_variable_t *input1,rt_variable_t *input2,int dim_index,
               int y_out,int y_in1,int y_in2,_func_int16_t_int16_t_int16_t *calc_func)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  int16_t iVar6;
  int y_out_00;
  int y_in1_00;
  int y_in2_00;
  int16_t *data_in2;
  int16_t *data_in1;
  int16_t *data_out;
  int z_in2;
  int z_in1;
  int z_out;
  int x_in2;
  int x_in1;
  int x_out;
  int x_size_in2;
  int x_size_in1;
  int x_size_out;
  int dim_size;
  int y_in1_local;
  int y_out_local;
  int dim_index_local;
  rt_variable_t *input2_local;
  rt_variable_t *input1_local;
  rt_variable_t *output_local;
  
  iVar1 = (output->shape).size;
  iVar2 = (output->shape).data[dim_index];
  iVar3 = (input1->shape).data[dim_index];
  iVar4 = (input2->shape).data[dim_index];
  for (x_in2 = 0; x_in2 < iVar2; x_in2 = x_in2 + 1) {
    y_out_00 = y_out * iVar2 + x_in2;
    y_in1_00 = y_in1 * iVar3 + x_in2 % iVar3;
    y_in2_00 = y_in2 * iVar4 + x_in2 % iVar4;
    if (dim_index + 1 < iVar1) {
      calc_dim_arithmetic_fixed16
                (output,input1,input2,dim_index + 1,y_out_00,y_in1_00,y_in2_00,calc_func);
    }
    else {
      pvVar5 = output->data;
      iVar6 = (*calc_func)(*(int16_t *)((long)input1->data + (long)y_in1_00 * 2),
                           *(int16_t *)((long)input2->data + (long)y_in2_00 * 2));
      *(int16_t *)((long)pvVar5 + (long)y_out_00 * 2) = iVar6;
    }
  }
  return;
}

Assistant:

void calc_dim_arithmetic_fixed16(rt_variable_t *output, rt_variable_t *input1,
                                 rt_variable_t *input2, int dim_index,
                                 int y_out, int y_in1, int y_in2,
                                 int16_t (*calc_func)(int16_t, int16_t)) {
  int dim_size = output->shape.size;
  int x_size_out = output->shape.data[dim_index];
  int x_size_in1 = input1->shape.data[dim_index];
  int x_size_in2 = input2->shape.data[dim_index];
  for (int x_out = 0; x_out < x_size_out; x_out++) {
    int x_in1 = (x_out % x_size_in1);
    int x_in2 = (x_out % x_size_in2);
    int z_out = y_out * x_size_out + x_out;
    int z_in1 = y_in1 * x_size_in1 + x_in1;
    int z_in2 = y_in2 * x_size_in2 + x_in2;
    if (dim_index + 1 < dim_size) {
      calc_dim_arithmetic_fixed16(output, input1, input2, dim_index + 1, z_out,
                                  z_in1, z_in2, calc_func);
    } else {
      int16_t *data_out = output->data;
      int16_t *data_in1 = input1->data;
      int16_t *data_in2 = input2->data;
      data_out[z_out] = calc_func(data_in1[z_in1], data_in2[z_in2]);
    }
  }
}